

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O2

int __thiscall deqp::BlockSingleStructCase::init(BlockSingleStructCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  deUint32 dVar1;
  StructType *this_01;
  UniformBlock *pUVar2;
  VarType VStack_78;
  Uniform local_60;
  
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_01 = ub::ShaderInterface::allocStruct(this_00,"S");
  ub::VarType::VarType((VarType *)&local_60,TYPE_INT_VEC3,4);
  ub::StructType::addMember(this_01,"a",(VarType *)&local_60,0xc00);
  ub::VarType::~VarType((VarType *)&local_60);
  ub::VarType::VarType(&VStack_78,TYPE_FLOAT_MAT3,2);
  ub::VarType::VarType((VarType *)&local_60,&VStack_78,4);
  ub::StructType::addMember(this_01,"b",(VarType *)&local_60,0);
  ub::VarType::~VarType((VarType *)&local_60);
  ub::VarType::~VarType(&VStack_78);
  ub::VarType::VarType((VarType *)&local_60,TYPE_FLOAT_VEC4,4);
  ub::StructType::addMember(this_01,"c",(VarType *)&local_60,0);
  ub::VarType::~VarType((VarType *)&local_60);
  pUVar2 = ub::ShaderInterface::allocBlock(this_00,"Block");
  ub::VarType::VarType(&VStack_78,this_01);
  ub::Uniform::Uniform(&local_60,"s",&VStack_78,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back
            (&pUVar2->m_uniforms,&local_60);
  ub::Uniform::~Uniform(&local_60);
  ub::VarType::~VarType(&VStack_78);
  dVar1 = this->m_layoutFlags;
  pUVar2->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&pUVar2->m_instanceName);
    dVar1 = this->m_numInstances;
    pUVar2->m_arraySize = dVar1;
  }
  return dVar1;
}

Assistant:

void init(void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH); // First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}